

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL SetFileAttributesA(LPCSTR lpFileName,DWORD dwFileAttributes)

{
  int iVar1;
  int *piVar2;
  char *local_c8;
  LPSTR UnixFileName;
  DWORD local_b8;
  BOOL bRet;
  DWORD dwLastError;
  mode_t new_mode;
  stat stat_data;
  CPalThread *pThread;
  DWORD dwFileAttributes_local;
  LPCSTR lpFileName_local;
  
  local_b8 = 0;
  UnixFileName._4_4_ = 0;
  local_c8 = (char *)0x0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  stat_data.__glibc_reserved[2] = (__syscall_slong_t)CorUnix::InternalGetCurrentThread();
  pThread._4_4_ = dwFileAttributes;
  if (((dwFileAttributes & 0x81) == 0) &&
     (pThread._4_4_ = 0x80, (PAL_InitializeChakraCoreCalled & 1U) == 0)) {
    abort();
  }
  if ((((pThread._4_4_ & 0x80) != 0) && (pThread._4_4_ != 0x80)) &&
     ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
    abort();
  }
  if (lpFileName == (LPCSTR)0x0) {
    local_b8 = 2;
  }
  else {
    local_c8 = CorUnix::InternalStrdup(lpFileName);
    if (local_c8 == (char *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      local_b8 = 8;
    }
    else {
      FILEDosToUnixPathA(local_c8);
      iVar1 = stat64(local_c8,(stat64 *)&dwLastError);
      if (iVar1 == 0) {
        bRet = (uint)stat_data.st_nlink;
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        if ((((uint)stat_data.st_nlink & 0x8000) == 0) && (((uint)stat_data.st_nlink & 0x4000) == 0)
           ) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          local_b8 = 5;
        }
        else {
          if ((pThread._4_4_ & 1) == 0) {
            if (((uint)stat_data.st_nlink & 0x100) != 0) {
              bRet = (uint)stat_data.st_nlink | 0x80;
            }
          }
          else {
            bRet = (uint)stat_data.st_nlink & 0xffffff6d;
          }
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          UnixFileName._4_4_ = 1;
          if ((bRet != (uint)stat_data.st_nlink) && (iVar1 = chmod(local_c8,bRet), iVar1 != 0)) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            local_b8 = FILEGetLastErrorFromErrnoAndFilename(local_c8);
            UnixFileName._4_4_ = 0;
          }
        }
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        piVar2 = __errno_location();
        strerror(*piVar2);
        local_b8 = FILEGetLastErrorFromErrnoAndFilename(local_c8);
      }
    }
  }
  if (local_b8 != 0) {
    CorUnix::CPalThread::SetLastError(local_b8);
  }
  CorUnix::InternalFree(local_c8);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return UnixFileName._4_4_;
  }
  abort();
}

Assistant:

BOOL
PALAPI
SetFileAttributesA(
           IN LPCSTR lpFileName,
           IN DWORD dwFileAttributes)
{
    CPalThread *pThread;
    struct stat stat_data;
    mode_t new_mode;

    DWORD dwLastError = 0;
    BOOL  bRet = FALSE;
    LPSTR UnixFileName = NULL;

    PERF_ENTRY(SetFileAttributesA);
    ENTRY("SetFileAttributesA(lpFileName=%p (%s), dwFileAttributes=%#x)\n",
        lpFileName?lpFileName:"NULL",
        lpFileName?lpFileName:"NULL", dwFileAttributes);

    pThread = InternalGetCurrentThread();

    /* Windows behavior for SetFileAttributes is that any valid attributes
    are set on a file and any invalid attributes are ignored. SetFileAttributes 
    returns success and does not set an error even if some or all of the 
    attributes are invalid. If all the attributes are invalid, SetFileAttributes
    sets a file's attribute to NORMAL. */

    /* If dwFileAttributes does not contain READONLY or NORMAL, set it to NORMAL
    and print a warning message. */
    if ( !(dwFileAttributes & (FILE_ATTRIBUTE_READONLY |FILE_ATTRIBUTE_NORMAL)) )
    {
        dwFileAttributes = FILE_ATTRIBUTE_NORMAL;
        WARN("dwFileAttributes(%#x) contains attributes that are either not supported "
            "or cannot be set via SetFileAttributes.\n");
    }
     
    if ( (dwFileAttributes & FILE_ATTRIBUTE_NORMAL) &&
         (dwFileAttributes != FILE_ATTRIBUTE_NORMAL) )
    {
        WARN("Ignoring FILE_ATTRIBUTE_NORMAL -- it must be used alone\n");
    }

    if (lpFileName == NULL)
    {
        dwLastError = ERROR_FILE_NOT_FOUND;
        goto done;
    }

    if ((UnixFileName = InternalStrdup(lpFileName)) == NULL)
    {
        ERROR("InternalStrdup() failed\n");
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }

    FILEDosToUnixPathA( UnixFileName );
    if ( stat(UnixFileName, &stat_data) != 0 )
    {
        TRACE("stat failed on %s; errno is %d (%s)\n", 
             UnixFileName, errno, strerror(errno));
        dwLastError = FILEGetLastErrorFromErrnoAndFilename(UnixFileName);
        goto done;
    }

    new_mode = stat_data.st_mode;
    TRACE("st_mode is %#x\n", new_mode);

    /* if we can't do GetFileAttributes on it, don't do SetFileAttributes */
    if ( !(new_mode & S_IFREG) && !(new_mode & S_IFDIR) )
    {
        ERROR("Not a regular file or directory, S_IFMT is %#x\n",
              new_mode & S_IFMT);
        dwLastError = ERROR_ACCESS_DENIED;
        goto done;    
    }

    /* set or unset the "read-only" attribute */
    if (dwFileAttributes & FILE_ATTRIBUTE_READONLY)
    {
        /* remove the write bit from everybody */
        new_mode &= ~(S_IWUSR | S_IWGRP | S_IWOTH);
    }
    else
    {
        /* give write permission to the owner if the owner
         * already has read permission */
        if ( new_mode & S_IRUSR )
        {
            new_mode |= S_IWUSR;
        }
    }
    TRACE("new mode is %#x\n", new_mode);

    bRet = TRUE;
    if ( new_mode != stat_data.st_mode )
    {
        if ( chmod(UnixFileName, new_mode) != 0 )
        {
            ERROR("chmod(%s, %#x) failed\n", UnixFileName, new_mode);
            dwLastError = FILEGetLastErrorFromErrnoAndFilename(UnixFileName);
            bRet = FALSE;
        }
    }

done:
    if (dwLastError)
    {
        pThread->SetLastError(dwLastError);
    }
    
    InternalFree(UnixFileName);

    LOGEXIT("SetFileAttributesA returns BOOL %d\n", bRet);
    PERF_EXIT(SetFileAttributesA);
    return bRet;
}